

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O2

Pass * wasm::createMultiMemoryLoweringPass(void)

{
  MultiMemoryLowering *this;
  
  this = (MultiMemoryLowering *)operator_new(0x138);
  MultiMemoryLowering::MultiMemoryLowering(this,false);
  return &this->super_Pass;
}

Assistant:

Pass* createMultiMemoryLoweringPass() { return new MultiMemoryLowering(false); }